

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

ImageNavigationHeader * lrit::getHeader<lrit::ImageNavigationHeader>(Buffer *b,int pos)

{
  int iVar1;
  unsigned_long *puVar2;
  size_t in_RCX;
  allocator *__nbytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  ImageNavigationHeader *in_RDI;
  char projectionName [32];
  HeaderReader<lrit::ImageNavigationHeader> r;
  ImageNavigationHeader *h;
  Buffer *in_stack_fffffffffffffec8;
  HeaderReader<lrit::ImageNavigationHeader> *in_stack_fffffffffffffed0;
  string *this;
  HeaderReader<lrit::ImageNavigationHeader> *in_stack_fffffffffffffed8;
  string *in;
  allocator local_e9;
  unsigned_long local_e8;
  size_t local_e0;
  string local_d8 [32];
  string local_b8 [32];
  char local_98 [55];
  undefined1 local_61;
  HeaderReader<lrit::ImageNavigationHeader> local_60;
  
  HeaderReader<lrit::ImageNavigationHeader>::HeaderReader
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,0);
  local_61 = 0;
  HeaderReader<lrit::ImageNavigationHeader>::getHeader(in_stack_fffffffffffffed8);
  HeaderReader<lrit::ImageNavigationHeader>::read(&local_60,(int)local_98,(void *)0x20,in_RCX);
  local_e0 = strlen(local_98);
  local_e8 = 0x20;
  puVar2 = std::min<unsigned_long>(&local_e0,&local_e8);
  in = (string *)*puVar2;
  __nbytes = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,local_98,(ulong)in,__nbytes);
  util::trimRight(in);
  this = local_b8;
  std::__cxx11::string::operator=((string *)&in_RDI->projectionName,this);
  std::__cxx11::string::~string(this);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  iVar1 = (int)in_RDI;
  HeaderReader<lrit::ImageNavigationHeader>::read(&local_60,iVar1 + 0x28,__buf,(size_t)__nbytes);
  HeaderReader<lrit::ImageNavigationHeader>::read(&local_60,iVar1 + 0x2c,__buf_00,(size_t)__nbytes);
  HeaderReader<lrit::ImageNavigationHeader>::read(&local_60,iVar1 + 0x30,__buf_01,(size_t)__nbytes);
  HeaderReader<lrit::ImageNavigationHeader>::read(&local_60,iVar1 + 0x34,__buf_02,(size_t)__nbytes);
  local_61 = 1;
  HeaderReader<lrit::ImageNavigationHeader>::~HeaderReader
            ((HeaderReader<lrit::ImageNavigationHeader> *)0x142a55);
  return in_RDI;
}

Assistant:

ImageNavigationHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<ImageNavigationHeader>(b, pos);
  auto h = r.getHeader();

  // Read 32 bytes for the projection name
  char projectionName[32];
  r.read(projectionName, sizeof(projectionName));

  // Convert to std::string for return value
  h.projectionName = util::trimRight(std::string(
      projectionName,
      std::min(strlen(projectionName), sizeof(projectionName))));

  r.read(&h.columnScaling);
  r.read(&h.lineScaling);
  r.read(&h.columnOffset);
  r.read(&h.lineOffset);
  return h;
}